

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdMtlx.cc
# Opt level: O0

bool tinyusdz::detail::ParseValue<bool>(AsciiParser *parser,bool *ret,string *err)

{
  bool bVar1;
  ostream *poVar2;
  string local_230 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210 [39];
  allocator local_1e9;
  string local_1e8 [32];
  fmt local_1c8 [32];
  ostringstream local_1a8 [8];
  ostringstream ss_e;
  bool local_29;
  string *psStack_28;
  bool val;
  string *err_local;
  bool *ret_local;
  AsciiParser *parser_local;
  
  psStack_28 = err;
  err_local = (string *)ret;
  ret_local = (bool *)parser;
  bVar1 = ascii::AsciiParser::ReadBasicType(parser,&local_29);
  if (bVar1) {
    err_local->_M_dataplus = (_Alloc_hider)(local_29 & 1);
    parser_local._7_1_ = 1;
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream(local_1a8);
    poVar2 = ::std::operator<<((ostream *)local_1a8,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdMtlx.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"ParseValue");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x84);
    ::std::operator<<(poVar2," ");
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_1e8,"Failed to parse a value of type `{}`",&local_1e9);
    tinyusdz::value::TypeTraits<bool>::type_name_abi_cxx11_();
    fmt::format<std::__cxx11::string>(local_1c8,(string *)local_1e8,local_210);
    poVar2 = ::std::operator<<((ostream *)local_1a8,(string *)local_1c8);
    ::std::operator<<(poVar2,"\n");
    ::std::__cxx11::string::~string((string *)local_1c8);
    ::std::__cxx11::string::~string((string *)local_210);
    ::std::__cxx11::string::~string(local_1e8);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
    if (psStack_28 != (string *)0x0) {
      ::std::__cxx11::ostringstream::str();
      ::std::__cxx11::string::operator+=((string *)psStack_28,local_230);
      ::std::__cxx11::string::~string(local_230);
    }
    parser_local._7_1_ = 0;
    ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
  }
  return (bool)(parser_local._7_1_ & 1);
}

Assistant:

bool ParseValue<bool>(tinyusdz::ascii::AsciiParser &parser, bool &ret,
                      std::string *err) {
  bool val;
  if (!parser.ReadBasicType(&val)) {
    PUSH_ERROR_AND_RETURN(fmt::format("Failed to parse a value of type `{}`",
                                      value::TypeTraits<bool>::type_name()));
  }

  ret = val;

  return true;
}